

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_extended_errcode(sqlite3 *db)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 7;
  if (db != (sqlite3 *)0x0) {
    iVar1 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar1 == 0) {
      iVar2 = sqlite3MisuseError(0x2cfcd);
      return iVar2;
    }
    if (db->mallocFailed == '\0') {
      iVar2 = db->errCode;
    }
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_extended_errcode(sqlite3 *db){
  if( db && !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  if( !db || db->mallocFailed ){
    return SQLITE_NOMEM_BKPT;
  }
  return db->errCode;
}